

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmClientContext.cpp
# Opt level: O2

void __thiscall
GmmLib::GmmClientContext::DestroyResInfoObject
          (GmmClientContext *this,GMM_RESOURCE_INFO *pResInfo,
          GmmClientAllocationCallbacks *pAllocCbs)

{
  int iVar1;
  undefined4 extraout_var;
  PFN_ClientFreeFunction UNRECOVERED_JUMPTABLE;
  long in_FS_OFFSET;
  GmmResourceInfoCommon local_6a8;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (pResInfo == (GMM_RESOURCE_INFO *)0x0) {
LAB_001c5fec:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    if ((pAllocCbs == (GmmClientAllocationCallbacks *)0x0) ||
       (pAllocCbs->pfnFree == (PFN_ClientFreeFunction)0x0)) {
      UNRECOVERED_JUMPTABLE = (PFN_ClientFreeFunction)this->_vptr_GmmClientContext[0x20];
    }
    else {
      iVar1 = (*(pResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])(pResInfo)
      ;
      if ((*(byte *)(CONCAT44(extraout_var,iVar1) + 0xd) & 2) != 0) {
        local_6a8.ClientType = GMM_KMD_VISTA;
        memset(&local_6a8.Surf,0,0x61c);
        local_6a8.ExistingSysMem.pExistingSysMem = 0;
        local_6a8.ExistingSysMem.pVirtAddress = 0;
        local_6a8.ExistingSysMem.pGfxAlignedVirtAddress = 0;
        local_6a8.ExistingSysMem.Size = 0;
        local_6a8.ExistingSysMem.IsGmmAllocated = '\0';
        local_6a8.ExistingSysMem._33_7_ = 0;
        local_6a8.SvmAddress = 0;
        local_6a8.pGmmUmdLibContext = 0;
        local_6a8.pGmmKmdLibContext = 0;
        local_6a8.MultiTileArch._0_1_ = 0;
        local_6a8.MultiTileArch.GpuVaMappingSet = '\0';
        local_6a8.MultiTileArch.LocalMemEligibilitySet = '\0';
        local_6a8.MultiTileArch.LocalMemPreferredSet = '\0';
        local_6a8.MultiTileArch.Reserved = 0;
        local_6a8.pPrivateData = 0;
        local_6a8.pClientContext = (GmmClientContext *)0x0;
        local_6a8._vptr_GmmResourceInfoCommon = (_func_int **)&PTR_IsPresentableformat_001d2828;
        GmmResourceInfoCommon::operator=(&pResInfo->super_GmmResourceInfoCommon,&local_6a8);
        GmmResourceInfoCommon::~GmmResourceInfoCommon(&local_6a8);
        goto LAB_001c5fec;
      }
      (*(pResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[3])(pResInfo);
      this = (GmmClientContext *)pAllocCbs->pUserData;
      UNRECOVERED_JUMPTABLE = pAllocCbs->pfnFree;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (*UNRECOVERED_JUMPTABLE)(this,pResInfo);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void GMM_STDCALL GmmLib::GmmClientContext::DestroyResInfoObject(GMM_RESOURCE_INFO *           pResInfo,
                                                                GmmClientAllocationCallbacks *pAllocCbs)
{
    __GMM_ASSERTPTR(pResInfo, VOIDRETURN);

    if(!pAllocCbs || !pAllocCbs->pfnFree)
    {
        return DestroyResInfoObject(pResInfo);
    }
    else
    {
        if(pResInfo->GetResFlags().Info.__PreallocatedResInfo)
        {
            *pResInfo = GmmLib::GmmResourceInfo();
        }
        else
        {
#ifdef _WIN32
            pResInfo->~GmmResourceInfoWin();
#else
            pResInfo->~GmmResourceInfoLin();
#endif
            pAllocCbs->pfnFree(pAllocCbs->pUserData, (void *)pResInfo);
            pResInfo = NULL;
        }
    }
}